

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::str_writer<char>>
          (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
           *this,format_specs *specs,str_writer<char> *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  size_t sVar4;
  byte bVar5;
  size_t __n;
  size_t size;
  void *pvVar6;
  void *__dest;
  char __tmp;
  ulong uVar7;
  buffer<char> *c;
  ptrdiff_t _Num_2;
  size_t __len;
  size_t __n_00;
  
  uVar7 = (ulong)(uint)specs->width;
  __n = f->size_;
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  __n_00 = uVar7 - __n;
  if (uVar7 < __n || __n_00 == 0) {
    uVar7 = lVar3 + __n;
    if ((ulong)puVar2[3] < uVar7) {
      (**(code **)*puVar2)(puVar2,uVar7);
      __n = f->size_;
    }
    puVar2[2] = uVar7;
    if (__n == 0) {
      return;
    }
    pvVar6 = (void *)(lVar3 + puVar2[1]);
LAB_0014a533:
    memmove(pvVar6,f->s,__n);
    return;
  }
  uVar7 = uVar7 + lVar3;
  if ((ulong)puVar2[3] < uVar7) {
    (**(code **)*puVar2)(puVar2,uVar7);
  }
  puVar2[2] = uVar7;
  pvVar6 = (void *)(lVar3 + puVar2[1]);
  bVar1 = (specs->fill).data_[0];
  bVar5 = specs->field_0x9 & 0xf;
  if (bVar5 == 3) {
    uVar7 = __n_00 >> 1;
    __dest = pvVar6;
    if (1 < __n_00) {
      __dest = (void *)((long)pvVar6 + uVar7);
      memset(pvVar6,(uint)bVar1,uVar7);
    }
    sVar4 = f->size_;
    if (sVar4 != 0) {
      memmove(__dest,f->s,sVar4);
    }
    __n_00 = __n_00 - uVar7;
    pvVar6 = (void *)((long)__dest + sVar4);
  }
  else {
    if (bVar5 == 2) {
      memset(pvVar6,(uint)bVar1,__n_00);
      __n = f->size_;
      if (__n == 0) {
        return;
      }
      pvVar6 = (void *)((long)pvVar6 + __n_00);
      goto LAB_0014a533;
    }
    sVar4 = f->size_;
    if (sVar4 != 0) {
      memmove(pvVar6,f->s,sVar4);
    }
    pvVar6 = (void *)((long)pvVar6 + sVar4);
  }
  memset(pvVar6,(uint)bVar1,__n_00);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }